

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

reentrant_put_transaction<void> *
density_tests::detail::
PutTestObject<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>,_2048UL,_2048UL>
::reentrant_put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                *i_queue,EasyRandom *param_2)

{
  sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
  *this;
  TestObject<2048UL,_2048UL> *i_source;
  reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *this_00;
  reentrant_put_transaction<void> *this_01;
  undefined8 in_RDX;
  ulong uVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> transaction;
  
  uVar1 = (ulong)&stack0xfffffffffffffff8 & 0xfffffffffffff800;
  *(undefined8 *)(uVar1 - 0x1030) = in_RDI;
  *(undefined8 *)(uVar1 - 0x1028) = in_RDI;
  *(undefined8 *)(uVar1 - 0x18) = in_RDI;
  *(undefined8 *)(uVar1 - 0x20) = in_RSI;
  *(undefined8 *)(uVar1 - 0x28) = in_RDX;
  *(undefined8 *)(uVar1 - 0x1020) = *(undefined8 *)(uVar1 - 0x20);
  *(TestObject<2048UL,_2048UL> **)(uVar1 - 0x1018) = (TestObject<2048UL,_2048UL> *)(uVar1 - 0x1000);
  *(undefined8 *)(uVar1 - 0x1808) = 0x2986e92;
  TestObject<2048UL,_2048UL>::TestObject((TestObject<2048UL,_2048UL> *)(uVar1 - 0x1000));
  this = *(sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
           **)(uVar1 - 0x1020);
  i_source = *(TestObject<2048UL,_2048UL> **)(uVar1 - 0x1018);
  *(undefined8 *)(uVar1 - 0x1808) = 0x2986eaf;
  density::
  sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::start_reentrant_push<density_tests::TestObject<2048ul,2048ul>>
            ((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)(uVar1 - 0x68)
             ,this,i_source);
  *(reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> **)(uVar1 - 0x1038) =
       (reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)(uVar1 - 0x68);
  *(undefined8 *)(uVar1 - 0x1808) = 0x2986ece;
  density::
  sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::reentrant_put_transaction<density_tests::TestObject<2048ul,2048ul>>::
  reentrant_put_transaction<density_tests::TestObject<2048ul,2048ul>,void>
            ((reentrant_put_transaction<density_tests::TestObject<2048ul,2048ul>> *)(uVar1 - 0x48),
             (reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)(uVar1 - 0x68)
            );
  this_00 = *(reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> **)
             (uVar1 - 0x1038);
  *(undefined8 *)(uVar1 - 0x1808) = 0x2986edb;
  density::
  sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_>::
  ~reentrant_put_transaction(this_00);
  *(undefined8 *)(uVar1 - 0x1808) = 0x2986ee8;
  TestObject<2048UL,_2048UL>::~TestObject((TestObject<2048UL,_2048UL> *)(uVar1 - 0x1000));
  *(undefined8 *)(uVar1 - 0x1808) = 0x2986eed;
  exception_checkpoint();
  this_01 = *(reentrant_put_transaction<void> **)(uVar1 - 0x1030);
  *(undefined8 *)(uVar1 - 0x1808) = 0x2986f04;
  density::
  sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::reentrant_put_transaction<void>::
  reentrant_put_transaction<density_tests::TestObject<2048ul,2048ul>,void>
            (this_01,(reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)
                     (uVar1 - 0x48));
  *(undefined8 *)(uVar1 - 0x1808) = 0x2986f11;
  density::
  sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_>::
  ~reentrant_put_transaction
            ((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)(uVar1 - 0x48)
            );
  return *(reentrant_put_transaction<void> **)(uVar1 - 0x1028);
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                auto transaction = i_queue.start_reentrant_push(ElementType());
                exception_checkpoint();
                return std::move(transaction);
            }